

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readOperands(InternalInstruction *insn)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool local_29;
  int sawRegImm;
  int needVVVV;
  int hasVVVV;
  int index;
  InternalInstruction *insn_local;
  
  bVar1 = false;
  iVar2 = readVVVV(insn);
  local_29 = false;
  if (iVar2 == 0) {
    local_29 = insn->vvvv != MODRM_REG_AL;
  }
  needVVVV = 0;
  do {
    if (4 < needVVVV) {
      if (local_29) {
        insn_local._4_4_ = -1;
      }
      else {
        insn_local._4_4_ = 0;
      }
      return insn_local._4_4_;
    }
    switch(x86OperandSets[insn->spec->operands][needVVVV].encoding) {
    case '\0':
    case '\x1e':
    case '\x1f':
      break;
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\b':
      iVar3 = readModRM(insn);
      if (iVar3 != 0) {
        return -1;
      }
      iVar3 = fixupReg(insn,x86OperandSets[insn->spec->operands] + needVVVV);
      if (iVar3 != 0) {
        return -1;
      }
      if ((x86OperandSets[insn->spec->operands][needVVVV].encoding != '\x01') &&
         (insn->eaDisplacement == EA_DISP_8)) {
        insn->displacement =
             (1 << (x86OperandSets[insn->spec->operands][needVVVV].encoding - 2 & 0x1f)) *
             insn->displacement;
      }
      break;
    case '\t':
      local_29 = false;
      if (iVar2 != 0) {
        return -1;
      }
      iVar3 = fixupReg(insn,x86OperandSets[insn->spec->operands] + needVVVV);
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\n':
      iVar3 = readMaskRegister(insn);
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x0f':
    case '\x10':
      return -1;
    case '\x11':
      if (bVar1) {
        insn->immediates[insn->numImmediatesConsumed] =
             insn->immediates[(int)(insn->numImmediatesConsumed - 1)] & 0xf;
        insn->numImmediatesConsumed = insn->numImmediatesConsumed + '\x01';
      }
      else {
        iVar3 = readImmediate(insn,'\x01');
        if (iVar3 != 0) {
          return -1;
        }
        if ((*(char *)((ulong)insn->spec->operands * 0xc + 0x263f81 + (long)needVVVV * 2) == '?') ||
           (*(char *)((ulong)insn->spec->operands * 0xc + 0x263f81 + (long)needVVVV * 2) == '@')) {
          bVar1 = true;
        }
      }
      break;
    case '\x12':
      iVar3 = readImmediate(insn,'\x02');
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x13':
      iVar3 = readImmediate(insn,'\x04');
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x14':
      iVar3 = readImmediate(insn,'\b');
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x15':
      iVar3 = readOpcodeRegister(insn,'\x01');
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x16':
      iVar3 = readOpcodeRegister(insn,'\x02');
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x17':
      iVar3 = readOpcodeRegister(insn,'\x04');
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x18':
      iVar3 = readOpcodeRegister(insn,'\b');
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x19':
      break;
    case '\x1a':
      iVar3 = readImmediate(insn,insn->immediateSize);
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x1b':
      iVar3 = readImmediate(insn,insn->addressSize);
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x1c':
      iVar3 = readOpcodeRegister(insn,'\0');
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x1d':
      break;
    default:
      return -1;
    }
    needVVVV = needVVVV + 1;
  } while( true );
}

Assistant:

static int readOperands(struct InternalInstruction *insn)
{
	int index;
	int hasVVVV, needVVVV;
	int sawRegImm = 0;

	// printf(">>> readOperands()\n");
	/* If non-zero vvvv specified, need to make sure one of the operands
	   uses it. */
	hasVVVV = !readVVVV(insn);
	needVVVV = hasVVVV && (insn->vvvv != 0);

	for (index = 0; index < X86_MAX_OPERANDS; ++index) {
		//printf(">>> encoding[%u] = %u\n", index, x86OperandSets[insn->spec->operands][index].encoding);
		switch (x86OperandSets[insn->spec->operands][index].encoding) {
			case ENCODING_NONE:
			case ENCODING_SI:
			case ENCODING_DI:
				break;
			case ENCODING_REG:
			CASE_ENCODING_RM:
				if (readModRM(insn))
					return -1;
				if (fixupReg(insn, &x86OperandSets[insn->spec->operands][index]))
					return -1;
				// Apply the AVX512 compressed displacement scaling factor.
				if (x86OperandSets[insn->spec->operands][index].encoding != ENCODING_REG && insn->eaDisplacement == EA_DISP_8)
					insn->displacement *= 1 << (x86OperandSets[insn->spec->operands][index].encoding - ENCODING_RM);
				break;
			case ENCODING_CB:
			case ENCODING_CW:
			case ENCODING_CD:
			case ENCODING_CP:
			case ENCODING_CO:
			case ENCODING_CT:
				// dbgprintf(insn, "We currently don't hande code-offset encodings");
				return -1;
			case ENCODING_IB:
				if (sawRegImm) {
					/* Saw a register immediate so don't read again and instead split the
					   previous immediate.  FIXME: This is a hack. */
					insn->immediates[insn->numImmediatesConsumed] =
						insn->immediates[insn->numImmediatesConsumed - 1] & 0xf;
					++insn->numImmediatesConsumed;
					break;
				}
				if (readImmediate(insn, 1))
					return -1;
				if (x86OperandSets[insn->spec->operands][index].type == TYPE_XMM128 ||
						x86OperandSets[insn->spec->operands][index].type == TYPE_XMM256)
					sawRegImm = 1;
				break;
			case ENCODING_IW:
				if (readImmediate(insn, 2))
					return -1;
				break;
			case ENCODING_ID:
				if (readImmediate(insn, 4))
					return -1;
				break;
			case ENCODING_IO:
				if (readImmediate(insn, 8))
					return -1;
				break;
			case ENCODING_Iv:
				if (readImmediate(insn, insn->immediateSize))
					return -1;
				break;
			case ENCODING_Ia:
				if (readImmediate(insn, insn->addressSize))
					return -1;
				break;
			case ENCODING_RB:
				if (readOpcodeRegister(insn, 1))
					return -1;
				break;
			case ENCODING_RW:
				if (readOpcodeRegister(insn, 2))
					return -1;
				break;
			case ENCODING_RD:
				if (readOpcodeRegister(insn, 4))
					return -1;
				break;
			case ENCODING_RO:
				if (readOpcodeRegister(insn, 8))
					return -1;
				break;
			case ENCODING_Rv:
				if (readOpcodeRegister(insn, 0))
					return -1;
				break;
			case ENCODING_FP:
				break;
			case ENCODING_VVVV:
				needVVVV = 0; /* Mark that we have found a VVVV operand. */
				if (!hasVVVV)
					return -1;
				if (fixupReg(insn, &x86OperandSets[insn->spec->operands][index]))
					return -1;
				break;
			case ENCODING_WRITEMASK:
				if (readMaskRegister(insn))
					return -1;
				break;
			case ENCODING_DUP:
				break;
			default:
				// dbgprintf(insn, "Encountered an operand with an unknown encoding.");
				return -1;
		}
	}

	/* If we didn't find ENCODING_VVVV operand, but non-zero vvvv present, fail */
	if (needVVVV) return -1;

	return 0;
}